

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacency.cpp
# Opt level: O0

char * __thiscall glcts::GeometryShaderAdjacency::getVertexShaderCode(GeometryShaderAdjacency *this)

{
  GeometryShaderAdjacency *this_local;
  
  return getVertexShaderCode::result;
}

Assistant:

const char* GeometryShaderAdjacency::getVertexShaderCode()
{
	static const char* result = "${VERSION}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"layout(location = 0) in vec2 position_data;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    gl_Position = vec4(position_data, 0, 1);\n"
								"}\n";
	return result;
}